

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mid2svg.cpp
# Opt level: O3

void drawEyelid(ostream *out,double x,double y,double width,double height)

{
  ostream *poVar1;
  double dVar2;
  double dVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"\t\t\t\t<path vector-effect=\"non-scaling-stroke\" d=\"",0x30);
  std::__ostream_insert<char,std::char_traits<char>>(out,"M ",2);
  poVar1 = std::ostream::_M_insert<double>(x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  dVar2 = height * 0.5 + y;
  std::ostream::_M_insert<double>(dVar2);
  std::__ostream_insert<char,std::char_traits<char>>(out," Q ",3);
  dVar3 = width * 0.5 + x;
  poVar1 = std::ostream::_M_insert<double>(dVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::_M_insert<double>(height + y);
  std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
  poVar1 = std::ostream::_M_insert<double>(width + x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::_M_insert<double>(dVar2);
  std::__ostream_insert<char,std::char_traits<char>>(out," Q ",3);
  poVar1 = std::ostream::_M_insert<double>(dVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::_M_insert<double>(y);
  std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
  poVar1 = std::ostream::_M_insert<double>(x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::_M_insert<double>(dVar2);
  std::__ostream_insert<char,std::char_traits<char>>(out," z\"",3);
  std::__ostream_insert<char,std::char_traits<char>>(out,"/>\n",3);
  return;
}

Assistant:

void drawEyelid(ostream& out, double x, double y, double width,
		double height) {
	out << "\t\t\t\t<path vector-effect=\"non-scaling-stroke\" d=\"";
	out << "M "  << x           << " " << y+height/2.0;
	out << " Q " << x+width/2.0 << " " << y+height;
	out << " "   << x+width     << " " << y+height/2.0;
	out << " Q " << x+width/2.0 << " " << y;
	out << " "   << x           << " " << y+height/2.0;
	out << " z\"";
	out << "/>\n";
}